

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pwm.c
# Opt level: O3

void pwm_chn_w(void *info,UINT8 Channel,UINT16 data)

{
  byte bVar1;
  uint uVar2;
  undefined3 in_register_00000031;
  
  if (4 < CONCAT31(in_register_00000031,Channel)) {
    return;
  }
  switch(CONCAT31(in_register_00000031,Channel)) {
  case 0:
    bVar1 = 0x10;
    if ((data & 0xf00) != 0) {
      bVar1 = (byte)(data >> 8) & 0xf;
    }
    *(byte *)((long)info + 0xb) = bVar1;
    *(byte *)((long)info + 10) = bVar1;
    return;
  case 1:
    uVar2 = data - 1 & 0xfff;
    *(short *)((long)info + 8) = (short)uVar2;
    uVar2 = (uVar2 >> 1) + 1;
    *(uint *)((long)info + 0x14) = uVar2;
    *(int *)((long)info + 0x18) = (int)(0x7fff00 / (ulong)uVar2);
    return;
  case 2:
    *(UINT16 *)((long)info + 0x10) = data;
    return;
  case 3:
    *(UINT16 *)((long)info + 0xe) = data;
    if (*(char *)((long)info + 0xc) != '\0') {
      return;
    }
    if (*(UINT16 *)((long)info + 0x10) != data) {
      return;
    }
    break;
  case 4:
    *(UINT16 *)((long)info + 0x10) = data;
    *(UINT16 *)((long)info + 0xe) = data;
    if (*(char *)((long)info + 0xc) != '\0') {
      return;
    }
  }
  *(uint *)((long)info + 0x14) = (uint)data;
  *(undefined1 *)((long)info + 0xc) = 1;
  return;
}

Assistant:

static void pwm_chn_w(void* info, UINT8 Channel, UINT16 data)
{
	pwm_chip* chip = (pwm_chip*)info;
	
	switch(Channel)
	{
	case 0x00/2:	// control register
		PWM_Set_Int(chip, data >> 8);
		break;
	case 0x02/2:	// cycle register
		PWM_Set_Cycle(chip, data);
		break;
	case 0x04/2:	// l ch
		chip->PWM_Out_L = data;
		break;
	case 0x06/2:	// r ch
		chip->PWM_Out_R = data;
		if (! chip->PWM_Mode)
		{
			if (chip->PWM_Out_L == chip->PWM_Out_R)
			{
				// fixes these terrible pops when
				// starting/stopping/pausing the song
				chip->PWM_Offset = data;
				chip->PWM_Mode = 0x01;
			}
		}
		break;
	case 0x08/2:	// mono ch
		chip->PWM_Out_L = data;
		chip->PWM_Out_R = data;
		if (! chip->PWM_Mode)
		{
			chip->PWM_Offset = data;
			chip->PWM_Mode = 0x01;
		}
		break;
	}
	
	return;
}